

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleBuilder.cpp
# Opt level: O2

bool __thiscall Refal2::CModuleBuilder::checkModuleExist(CModuleBuilder *this,CToken *token)

{
  bool bVar1;
  allocator local_41;
  string local_40;
  
  bVar1 = attemptModule(this);
  if (!bVar1) {
    std::__cxx11::string::string
              ((string *)&local_40,"Wrong function declaration out of module",&local_41);
    fatalError(this,token,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return bVar1;
}

Assistant:

bool CModuleBuilder::checkModuleExist( const CToken& token )
{
	if( attemptModule() ) {
		return true;
	}
	fatalError( token, "Wrong function declaration out of module" );
	return false;
}